

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.hpp
# Opt level: O0

string * RRStepTypeToStr_abi_cxx11_(RRStepType step)

{
  logic_error *this;
  undefined4 in_ESI;
  string *in_RDI;
  allocator local_1f;
  allocator local_1e;
  allocator local_1d [16];
  allocator local_d [13];
  
  switch(in_ESI) {
  case 0:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"I",local_d);
    std::allocator<char>::~allocator((allocator<char> *)local_d);
    break;
  case 1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"J",local_1d);
    std::allocator<char>::~allocator((allocator<char> *)local_1d);
    break;
  case 2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"K",&local_1e);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e);
    break;
  case 3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"L",&local_1f);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f);
    break;
  default:
    this = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this,"Missing RRStepType");
    __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return in_RDI;
}

Assistant:

inline std::string RRStepTypeToStr(RRStepType step)
{
    switch(step)
    {
        case RRStepType::I:
            return "I";
        case RRStepType::J:
            return "J";
        case RRStepType::K:
            return "K";
        case RRStepType::L:
            return "L";
        default:
            throw std::logic_error("Missing RRStepType");
    }
}